

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

void __thiscall QSimplex::dumpMatrix(QSimplex *this)

{
  qreal *pqVar1;
  Data *pDVar2;
  undefined1 *puVar3;
  int iVar4;
  storage_type *psVar5;
  int iVar6;
  char16_t *pcVar7;
  int j;
  int iVar8;
  long lVar9;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._0_4_ = 2;
  local_58.size._4_4_ = 0;
  local_58.d._4_4_ = 0;
  local_58.ptr._0_4_ = 0;
  local_58.ptr._4_4_ = 0;
  local_58.size._0_4_ = 0;
  local_40 = "default";
  QMessageLogger::debug((char *)&local_58,"---- Simplex Matrix ----\n");
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = "       ";
  latin1.m_size = 7;
  QString::QString((QString *)&local_78,latin1);
  for (iVar8 = 0; iVar8 < this->columns; iVar8 = iVar8 + 1) {
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("  <%1 >",8);
    QVar10.m_data = psVar5;
    QVar10.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar10);
    QString::arg<int,_true>((QString *)&local_58,(QString *)&local_90,iVar8,2,10,(QChar)0x20);
    QString::append((QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  }
  local_58.d._0_4_ = 2;
  local_58.d._4_4_ = 0;
  local_58.ptr._0_4_ = 0;
  local_58.ptr._4_4_ = 0;
  local_58.size._0_4_ = 0;
  local_58.size._4_4_ = 0;
  local_40 = "default";
  QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
  pcVar7 = local_90.ptr;
  if (local_90.ptr == (char16_t *)0x0) {
    pcVar7 = (char16_t *)&QByteArray::_empty;
  }
  QMessageLogger::debug((char *)&local_58,"%s",pcVar7);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
  for (iVar8 = 0; iVar8 < this->rows; iVar8 = iVar8 + 1) {
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("Row %1:",8);
    QVar11.m_data = psVar5;
    QVar11.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar11);
    QString::arg<int,_true>((QString *)&local_58,(QString *)&local_90,iVar8,2,10,(QChar)0x20);
    pDVar2 = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    pcVar7 = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(local_78.d,0);
    local_58.d._4_4_ = (undefined4)((ulong)local_78.d >> 0x20);
    local_58.ptr._0_4_ = SUB84(local_78.ptr,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)local_78.ptr >> 0x20);
    puVar3 = (undefined1 *)CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = (undefined4)local_78.size;
    local_58.size._4_4_ = (undefined4)((ulong)local_78.size >> 0x20);
    local_78.d = pDVar2;
    local_78.ptr = pcVar7;
    local_78.size = (qsizetype)puVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    iVar4 = this->columns;
    iVar6 = iVar4 * iVar8;
    pqVar1 = this->matrix;
    for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
      psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1",3);
      QVar12.m_data = psVar5;
      QVar12.m_size = (qsizetype)&local_90;
      QString::fromLatin1(QVar12);
      QString::arg_impl(pqVar1[iVar6 + lVar9],(int)&local_58,(char)&local_90,7,(QChar)0x66);
      QString::append((QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      iVar4 = this->columns;
    }
    local_58.d._0_4_ = 2;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_40 = "default";
    QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
    pcVar7 = local_90.ptr;
    if (local_90.ptr == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_58,"%s",pcVar7);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
  }
  local_58.d._0_4_ = 2;
  local_58.d._4_4_ = 0;
  local_58.ptr._0_4_ = 0;
  local_58.ptr._4_4_ = 0;
  local_58.size._0_4_ = 0;
  local_58.size._4_4_ = 0;
  local_40 = "default";
  QMessageLogger::debug((char *)&local_58,"------------------------\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSimplex::dumpMatrix()
{
    qDebug("---- Simplex Matrix ----\n");

    QString str("       "_L1);
    for (int j = 0; j < columns; ++j)
        str += QString::fromLatin1("  <%1 >").arg(j, 2);
    qDebug("%s", qPrintable(str));
    for (int i = 0; i < rows; ++i) {
        str = QString::fromLatin1("Row %1:").arg(i, 2);

        qreal *row = matrix + i * columns;
        for (int j = 0; j < columns; ++j)
            str += QString::fromLatin1("%1").arg(row[j], 7, 'f', 2);
        qDebug("%s", qPrintable(str));
    }
    qDebug("------------------------\n");
}